

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection.cpp
# Opt level: O0

bool flatbuffers::anon_unknown_96::VerifyStruct
               (Verifier *v,Table *parent_table,voffset_t field_offset,Object *obj,bool required)

{
  voffset_t elem_off;
  int32_t iVar1;
  int32_t iVar2;
  undefined1 local_35;
  voffset_t offset;
  bool required_local;
  Object *obj_local;
  voffset_t field_offset_local;
  Table *parent_table_local;
  Verifier *v_local;
  
  elem_off = Table::GetOptionalFieldOffset(parent_table,field_offset);
  if ((required) && (elem_off == 0)) {
    v_local._7_1_ = false;
  }
  else {
    local_35 = true;
    if (elem_off != 0) {
      iVar1 = reflection::Object::bytesize(obj);
      iVar2 = reflection::Object::minalign(obj);
      local_35 = VerifierTemplate<false>::VerifyFieldStruct
                           (v,(uint8_t *)parent_table,elem_off,(long)iVar1,(long)iVar2);
    }
    v_local._7_1_ = local_35;
  }
  return v_local._7_1_;
}

Assistant:

static bool VerifyStruct(flatbuffers::Verifier &v,
                         const flatbuffers::Table &parent_table,
                         voffset_t field_offset, const reflection::Object &obj,
                         bool required) {
  auto offset = parent_table.GetOptionalFieldOffset(field_offset);
  if (required && !offset) { return false; }

  return !offset ||
         v.VerifyFieldStruct(reinterpret_cast<const uint8_t *>(&parent_table),
                             offset, obj.bytesize(), obj.minalign());
}